

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O2

REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,char *root_filename)

{
  REF_INT RVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_DBL *pRVar4;
  REF_STATUS RVar5;
  uint uVar6;
  FILE *__s;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  double *pdVar14;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  ulong uStackY_360;
  REF_INT nnode;
  REF_DICT local_2f8;
  long local_2f0;
  ulong local_2e8;
  ulong local_2e0;
  ulong local_2d8;
  REF_INT *g2l;
  REF_INT nface;
  REF_INT *l2g;
  ulong local_2b8;
  ulong local_2b0;
  REF_INT nodes [27];
  REF_DBL d [12];
  REF_DBL m [6];
  REF_DBL m_1 [6];
  char viz_file [256];
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->cell[3];
  if (ref_grid->twod == 0) {
    snprintf(viz_file,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
             (ulong)(uint)ref_grid->mpi->id);
    __s = fopen(viz_file,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",viz_file);
      pcVar19 = "unable to open file";
      uVar15 = 0x39a;
LAB_0017e91c:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar15,"ref_export_tec_metric_ellipse",pcVar19);
      return 2;
    }
    fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
    lVar16 = (long)pRVar2->max;
    if (lVar16 < 0) {
      pcVar19 = "malloc o2n of REF_INT negative";
      uVar15 = 0x39f;
LAB_0017e8f0:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar15,"ref_export_tec_metric_ellipse",pcVar19);
      return 1;
    }
    pvVar7 = malloc(lVar16 * 4);
    if (pvVar7 == (void *)0x0) {
      pcVar19 = "malloc o2n of REF_INT NULL";
      uVar15 = 0x39f;
      goto LAB_0017e91c;
    }
    for (lVar8 = 0; lVar16 != lVar8; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)pvVar7 + lVar8 * 4) = 0xffffffff;
    }
    uVar23 = 0;
    for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
      RVar5 = ref_cell_nodes(pRVar3,iVar17,nodes);
      if (RVar5 == 0) {
        uVar22 = (ulong)(uint)pRVar3->node_per;
        if (pRVar3->node_per < 1) {
          uVar22 = 0;
        }
        for (uVar12 = 0; uVar22 != uVar12; uVar12 = uVar12 + 1) {
          if (*(int *)((long)pvVar7 + (long)nodes[uVar12] * 4) == -1) {
            *(uint *)((long)pvVar7 + (long)nodes[uVar12] * 4) = uVar23;
            uVar23 = uVar23 + 1;
          }
        }
      }
    }
    if ((int)uVar23 < 0) {
      pcVar19 = "malloc n2o of REF_INT negative";
      uVar15 = 0x3aa;
      goto LAB_0017e8f0;
    }
    local_2b8 = (ulong)uVar23;
    pvVar9 = malloc(local_2b8 * 4);
    if (pvVar9 == (void *)0x0) {
      pcVar19 = "malloc n2o of REF_INT NULL";
      uVar15 = 0x3aa;
      goto LAB_0017e91c;
    }
    uVar12 = 0;
    uVar22 = (ulong)(uint)pRVar2->max;
    if (pRVar2->max < 1) {
      uVar22 = uVar12;
    }
    for (; uVar22 != uVar12; uVar12 = uVar12 + 1) {
      lVar16 = (long)*(int *)((long)pvVar7 + uVar12 * 4);
      if (lVar16 != -1) {
        *(int *)((long)pvVar9 + lVar16 * 4) = (int)uVar12;
      }
    }
    fprintf(__s,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
            (ulong)(uVar23 * 0x6c),(ulong)(uVar23 * 0x6c),"point","felineseg");
    local_2f0 = CONCAT44(local_2f0._4_4_,uVar23);
    uVar22 = 0;
    while (uVar22 != local_2b8) {
      RVar1 = *(REF_INT *)((long)pvVar9 + uVar22 * 4);
      local_2b0 = uVar22;
      uVar6 = ref_node_metric_get(pRVar2,RVar1,m);
      if (uVar6 != 0) {
        uStackY_360 = (ulong)uVar6;
        pcVar19 = "get";
        uVar15 = 0x3b9;
        goto LAB_0017e66a;
      }
      uVar6 = ref_matrix_diag_m(m,d);
      if (uVar6 != 0) {
        uStackY_360 = (ulong)uVar6;
        pcVar19 = "diag";
        uVar15 = 0x3ba;
        goto LAB_0017e66a;
      }
      uVar6 = ref_matrix_descending_eig(d);
      if (uVar6 != 0) {
        uStackY_360 = (ulong)uVar6;
        pcVar19 = "sort eig";
        uVar15 = 0x3bb;
        goto LAB_0017e66a;
      }
      lVar16 = (long)RVar1;
      uVar22 = 0;
      while (uVar12 = uVar22, uVar12 != 3) {
        local_2e8 = uVar12 + 1;
        uVar18 = local_2e8 & 0xffffffff;
        if (local_2e8 == 3) {
          uVar18 = 0;
        }
        local_2e0 = uVar18 * 3 + 3 & 0xffffffff;
        dVar25 = 0.0;
        iVar17 = 0x24;
        local_2d8 = uVar12;
        while (bVar24 = iVar17 != 0, iVar17 = iVar17 + -1, uVar22 = local_2e8, bVar24) {
          dVar26 = cos(dVar25 * 0.17453292519943278);
          dVar27 = d[local_2d8];
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          dVar28 = sin(dVar25 * 0.17453292519943278);
          dVar29 = d[uVar18];
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          dVar29 = (dVar28 * 0.5) / dVar29;
          dVar27 = (dVar26 * 0.5) / dVar27;
          pRVar4 = pRVar2->real;
          fprintf(__s," %.16e %.16e %.16e\n",
                  d[uVar12 * 3 + 3] * dVar27 + d[local_2e0] * dVar29 + pRVar4[lVar16 * 0xf],
                  d[uVar12 * 3 + 4] * dVar27 + d[uVar18 * 3 + 4 & 0xffffffff] * dVar29 +
                  pRVar4[lVar16 * 0xf + 1],
                  dVar27 * d[uVar12 * 3 + 5] + dVar29 * d[uVar18 * 3 + 5 & 0xffffffff] +
                  pRVar4[lVar16 * 0xf + 2]);
          dVar25 = dVar25 + 1.0;
        }
      }
      uVar22 = local_2b0 + 1;
    }
    uVar6 = 1;
    for (iVar17 = 0; iVar17 != 3; iVar17 = iVar17 + 1) {
      uVar20 = iVar17 * uVar23 * 0x24;
      uVar11 = uVar6;
      for (iVar10 = 0; iVar10 != (int)local_2f0; iVar10 = iVar10 + 1) {
        iVar13 = 0x23;
        uVar21 = uVar11;
        while( true ) {
          uVar22 = (ulong)uVar21;
          bVar24 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          if (bVar24) break;
          uVar21 = uVar21 + 1;
          fprintf(__s," %d %d\n",uVar22,(ulong)uVar21);
        }
        fprintf(__s," %d %d\n",(ulong)(iVar10 * 0x24 + uVar20 + 0x24),(uVar20 | 1) + iVar10 * 0x24);
        uVar11 = uVar11 + 0x24;
      }
      uVar6 = uVar6 + uVar23 * 0x24;
    }
    free(pvVar9);
    free(pvVar7);
    uVar23 = ref_export_tec_surf_zone(ref_grid,(FILE *)__s);
    if (uVar23 == 0) {
LAB_0017eca6:
      fclose(__s);
      return 0;
    }
    uStackY_360 = (ulong)uVar23;
    pcVar19 = "ellipse surf";
    uVar15 = 0x3d9;
    goto LAB_0017e66a;
  }
  snprintf(viz_file,0x100,"%s_n%d_p%d_ellipse.tec",root_filename,(ulong)(uint)ref_grid->mpi->n,
           (ulong)(uint)ref_grid->mpi->id);
  __s = fopen(viz_file,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",viz_file);
    pcVar19 = "unable to open file";
    uVar15 = 0x334;
LAB_0017e63f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar15
           ,"ref_export_tec_metric_ellipse_twod",pcVar19);
    uStackY_360 = 2;
  }
  else {
    fwrite("title=\"tecplot refine metric axes\"\n",0x23,1,__s);
    fwrite("variables = \"x\" \"y\"\n",0x14,1,__s);
    lVar16 = (long)pRVar2->max;
    if (lVar16 < 0) {
      pcVar19 = "malloc o2n of REF_INT negative";
      uVar15 = 0x339;
LAB_0017e5ed:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar15,"ref_export_tec_metric_ellipse_twod",pcVar19);
      uStackY_360 = 1;
    }
    else {
      pvVar7 = malloc(lVar16 * 4);
      if (pvVar7 == (void *)0x0) {
        pcVar19 = "malloc o2n of REF_INT NULL";
        uVar15 = 0x339;
        goto LAB_0017e63f;
      }
      for (lVar8 = 0; lVar16 != lVar8; lVar8 = lVar8 + 1) {
        *(undefined4 *)((long)pvVar7 + lVar8 * 4) = 0xffffffff;
      }
      uVar23 = 0;
      for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
        RVar5 = ref_cell_nodes(pRVar3,iVar17,(REF_INT *)d);
        if (RVar5 == 0) {
          uVar22 = (ulong)(uint)pRVar3->node_per;
          if (pRVar3->node_per < 1) {
            uVar22 = 0;
          }
          for (uVar12 = 0; uVar22 != uVar12; uVar12 = uVar12 + 1) {
            lVar16 = (long)*(int *)((long)d + uVar12 * 4);
            if (*(int *)((long)pvVar7 + lVar16 * 4) == -1) {
              *(uint *)((long)pvVar7 + lVar16 * 4) = uVar23;
              uVar23 = uVar23 + 1;
            }
          }
        }
      }
      if ((int)uVar23 < 0) {
        pcVar19 = "malloc n2o of REF_INT negative";
        uVar15 = 0x344;
        goto LAB_0017e5ed;
      }
      pvVar9 = malloc((ulong)uVar23 * 4);
      if (pvVar9 == (void *)0x0) {
        pcVar19 = "malloc n2o of REF_INT NULL";
        uVar15 = 0x344;
        goto LAB_0017e63f;
      }
      uVar12 = 0;
      uVar22 = (ulong)(uint)pRVar2->max;
      if (pRVar2->max < 1) {
        uVar22 = uVar12;
      }
      for (; uVar22 != uVar12; uVar12 = uVar12 + 1) {
        lVar16 = (long)*(int *)((long)pvVar7 + uVar12 * 4);
        if (lVar16 != -1) {
          *(int *)((long)pvVar9 + lVar16 * 4) = (int)uVar12;
        }
      }
      fprintf(__s,"zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uVar23 * 0xc),(ulong)(uVar23 * 0xc),"point","felineseg");
      for (uVar22 = 0; uVar22 != uVar23; uVar22 = uVar22 + 1) {
        RVar1 = *(REF_INT *)((long)pvVar9 + uVar22 * 4);
        uVar6 = ref_node_metric_get(pRVar2,RVar1,m_1);
        if (uVar6 != 0) {
          uStackY_360 = (ulong)uVar6;
          pcVar19 = "get";
          uVar15 = 0x353;
          goto LAB_0017ea98;
        }
        uVar6 = ref_matrix_diag_m(m_1,m);
        if (uVar6 != 0) {
          uStackY_360 = (ulong)uVar6;
          pcVar19 = "diag";
          uVar15 = 0x354;
          goto LAB_0017ea98;
        }
        uVar6 = ref_matrix_descending_eig(m);
        if (uVar6 != 0) {
          uStackY_360 = (ulong)uVar6;
          pcVar19 = "sort eig";
          uVar15 = 0x355;
          goto LAB_0017ea98;
        }
        pdVar14 = m + 5;
        uVar12 = 0xffffffffffffffff;
        dVar25 = -1.0;
        for (uVar18 = 0; uVar18 != 3; uVar18 = uVar18 + 1) {
          dVar27 = *pdVar14;
          if (dVar27 <= -dVar27) {
            dVar27 = -dVar27;
          }
          if (dVar25 < dVar27) {
            uVar12 = uVar18;
          }
          uVar12 = uVar12 & 0xffffffff;
          if (dVar27 <= dVar25) {
            dVar27 = dVar25;
          }
          dVar25 = dVar27;
          pdVar14 = pdVar14 + 3;
        }
        iVar17 = (int)uVar12;
        if (iVar17 == -1) {
          pcVar19 = "couldn\'t find best y";
          uVar15 = 0x35e;
          goto LAB_0017e5ed;
        }
        iVar13 = (uint)(iVar17 < 2) * 3 + iVar17 + -2;
        iVar10 = iVar17 + -1 + (uint)(iVar17 < 1) * 3;
        local_2d8 = (ulong)iVar13;
        local_2e0 = (ulong)(iVar13 * 3 + 3);
        local_2e8 = (ulong)(iVar10 * 3 + 3);
        local_2f0 = (long)(iVar13 * 3 + 4);
        dVar25 = 0.0;
        iVar17 = 0xc;
        while (bVar24 = iVar17 != 0, iVar17 = iVar17 + -1, bVar24) {
          dVar26 = cos(dVar25 * 0.5235987755982983);
          dVar27 = m[local_2d8];
          if (dVar27 < 0.0) {
            dVar27 = sqrt(dVar27);
          }
          else {
            dVar27 = SQRT(dVar27);
          }
          dVar28 = sin(dVar25 * 0.5235987755982983);
          dVar29 = m[iVar10];
          if (dVar29 < 0.0) {
            dVar29 = sqrt(dVar29);
          }
          else {
            dVar29 = SQRT(dVar29);
          }
          dVar29 = (dVar28 * 0.5) / dVar29;
          dVar27 = (dVar26 * 0.5) / dVar27;
          fprintf(__s," %.16e %.16e\n",
                  m[local_2e0] * dVar27 + m[local_2e8] * dVar29 + pRVar2->real[(long)RVar1 * 0xf],
                  dVar27 * m[local_2f0] + dVar29 * m[iVar10 * 3 + 4] +
                  pRVar2->real[(long)RVar1 * 0xf + 1]);
          dVar25 = dVar25 + 1.0;
        }
      }
      uVar6 = 2;
      for (uVar11 = 0; uVar11 != uVar23; uVar11 = uVar11 + 1) {
        iVar17 = 0xb;
        uVar20 = uVar6;
        while( true ) {
          bVar24 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          if (bVar24) break;
          fprintf(__s," %d %d\n",(ulong)(uVar20 - 1),(ulong)uVar20);
          uVar20 = uVar20 + 1;
        }
        fprintf(__s," %d %d\n",(ulong)(uVar11 * 0xc + 0xc),uVar11 * 0xc + 1);
        uVar6 = uVar6 + 0xc;
      }
      free(pvVar9);
      free(pvVar7);
      pRVar2 = ref_grid->node;
      uVar23 = ref_dict_create(&local_2f8);
      if (uVar23 == 0) {
        pRVar3 = ref_grid->cell[3];
        for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
          RVar5 = ref_cell_nodes(pRVar3,iVar17,nodes);
          if ((RVar5 == 0) &&
             (uVar23 = ref_dict_store(local_2f8,nodes[pRVar3->node_per],-1), uVar23 != 0)) {
            uStackY_360 = (ulong)uVar23;
            pcVar19 = "mark tri";
            uVar15 = 0x268;
            goto LAB_0017e9fe;
          }
        }
        pRVar3 = ref_grid->cell[6];
        for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
          RVar5 = ref_cell_nodes(pRVar3,iVar17,nodes);
          if ((RVar5 == 0) &&
             (uVar23 = ref_dict_store(local_2f8,nodes[pRVar3->node_per],-1), uVar23 != 0)) {
            uStackY_360 = (ulong)uVar23;
            pcVar19 = "mark qua";
            uVar15 = 0x26d;
            goto LAB_0017e9fe;
          }
        }
        iVar17 = local_2f8->n;
        uVar23 = 0xffffffff;
        if (0 < iVar17) {
          uVar23 = *local_2f8->key;
        }
        lVar16 = 0;
        while (lVar8 = lVar16, lVar8 < iVar17) {
          uVar6 = ref_grid_tri_qua_id_nodes(ref_grid,uVar23,&nnode,&nface,&g2l,&l2g);
          if (uVar6 != 0) {
            uStackY_360 = (ulong)uVar6;
            pcVar19 = "extract this boundary";
            uVar15 = 0x272;
            goto LAB_0017e9fe;
          }
          fprintf(__s,"zone t=\"face%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)uVar23,(ulong)(uint)nnode,(ulong)(uint)nface,"point","fequadrilateral");
          for (lVar16 = 0; lVar16 < nnode; lVar16 = lVar16 + 1) {
            pRVar4 = pRVar2->real;
            fprintf(__s," %.16e %.16e\n",pRVar4[(long)l2g[lVar16] * 0xf],
                    pRVar4[(long)l2g[lVar16] * 0xf + 1]);
          }
          pRVar3 = ref_grid->cell[3];
          for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
            RVar5 = ref_cell_nodes(pRVar3,iVar17,nodes);
            if ((RVar5 == 0) && (uVar23 == nodes[pRVar3->node_per])) {
              nodes[3] = nodes[2];
              for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                fprintf(__s," %d",(ulong)(g2l[nodes[lVar16]] + 1));
              }
              fputc(10,__s);
            }
          }
          pRVar3 = ref_grid->cell[6];
          for (iVar17 = 0; iVar17 < pRVar3->max; iVar17 = iVar17 + 1) {
            RVar5 = ref_cell_nodes(pRVar3,iVar17,nodes);
            if ((RVar5 == 0) && (uVar23 == nodes[pRVar3->node_per])) {
              for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                fprintf(__s," %d",(ulong)(g2l[nodes[lVar16]] + 1));
              }
              fputc(10,__s);
            }
          }
          free(l2g);
          free(g2l);
          lVar16 = lVar8 + 1;
          iVar17 = local_2f8->n;
          uVar23 = 0xffffffff;
          if ((int)lVar16 < iVar17) {
            uVar23 = local_2f8->key[lVar8 + 1];
          }
        }
        uVar23 = ref_dict_free(local_2f8);
        if (uVar23 == 0) goto LAB_0017eca6;
        uStackY_360 = (ulong)uVar23;
        pcVar19 = "free dict";
        uVar15 = 0x295;
      }
      else {
        uStackY_360 = (ulong)uVar23;
        pcVar19 = "create dict";
        uVar15 = 0x263;
      }
LAB_0017e9fe:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar15,"ref_export_tec_twod_zone",uStackY_360,pcVar19);
      pcVar19 = "ellipse surf";
      uVar15 = 0x377;
LAB_0017ea98:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",
             uVar15,"ref_export_tec_metric_ellipse_twod",uStackY_360,pcVar19);
    }
  }
  pcVar19 = "2d met";
  uVar15 = 0x390;
LAB_0017e66a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_export.c",uVar15,
         "ref_export_tec_metric_ellipse",uStackY_360,pcVar19);
  return (REF_STATUS)uStackY_360;
}

Assistant:

REF_FCN REF_STATUS ref_export_tec_metric_ellipse(REF_GRID ref_grid,
                                                 const char *root_filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT nnode, node;
  REF_INT *o2n, *n2o;
  REF_INT ncell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL m[6], d[12];
  REF_DBL x, y, z;
  REF_DBL ex, ey;
  FILE *file;
  char viz_file[256];
  REF_INT i, n = 36;
  REF_INT e0, e1;
  REF_DBL dt = ref_math_in_radians(360.0 / (REF_DBL)n);
  REF_DBL scale = 0.5; /* so the ellipses touch for an ideal grid */

  if (ref_grid_twod(ref_grid)) {
    RSS(ref_export_tec_metric_ellipse_twod(ref_grid, root_filename), "2d met");
    return REF_SUCCESS;
  }

  snprintf(viz_file, 256, "%s_n%d_p%d_ellipse.tec", root_filename,
           ref_mpi_n(ref_grid_mpi(ref_grid)),
           ref_mpi_rank(ref_grid_mpi(ref_grid)));

  file = fopen(viz_file, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", viz_file);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"tecplot refine metric axes\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"\n");

  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);
  nnode = 0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (REF_EMPTY == o2n[nodes[node]]) {
        o2n[nodes[node]] = nnode;
        nnode++;
      }
    }
  }

  ref_malloc(n2o, nnode, REF_INT);
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != o2n[node]) {
      n2o[o2n[node]] = node;
    }
  }

  ncell = nnode * n;

  fprintf(file,
          "zone t=\"ellipse\", nodes=%d, elements=%d, datapacking=%s, "
          "zonetype=%s\n",
          3 * ncell, 3 * ncell, "point", "felineseg");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_metric_get(ref_node, n2o[node], m), "get");
    RSS(ref_matrix_diag_m(m, d), "diag");
    RSS(ref_matrix_descending_eig(d), "sort eig");
    for (e0 = 0; e0 < 3; e0++) {
      e1 = e0 + 1;
      if (e1 == 3) e1 = 0;
      for (i = 0; i < n; i++) {
        ex = scale * cos(i * dt) / sqrt(d[e0]);
        ey = scale * sin(i * dt) / sqrt(d[e1]);
        x = d[3 + 3 * e0] * ex + d[3 + 3 * e1] * ey;
        y = d[4 + 3 * e0] * ex + d[4 + 3 * e1] * ey;
        z = d[5 + 3 * e0] * ex + d[5 + 3 * e1] * ey;
        fprintf(file, " %.16e %.16e %.16e\n",
                ref_node_xyz(ref_node, 0, n2o[node]) + x,
                ref_node_xyz(ref_node, 1, n2o[node]) + y,
                ref_node_xyz(ref_node, 2, n2o[node]) + z);
      }
    }
  }

  for (e0 = 0; e0 < 3; e0++)
    for (node = 0; node < nnode; node++) {
      for (i = 0; i < n - 1; i++)
        fprintf(file, " %d %d\n", i + node * n + 1 + ncell * e0,
                i + 1 + node * n + 1 + ncell * e0);
      fprintf(file, " %d %d\n", n + node * n + ncell * e0,
              1 + node * n + ncell * e0);
    }

  ref_free(n2o);
  ref_free(o2n);

  RSS(ref_export_tec_surf_zone(ref_grid, file), "ellipse surf");

  fclose(file);

  return REF_SUCCESS;
}